

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O3

void __thiscall
osc::ReceivedMessageArgument::AsBlobUnchecked
          (ReceivedMessageArgument *this,void **data,osc_bundle_element_size_t *size)

{
  uint *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  
  puVar1 = (uint *)this->argumentPtr_;
  uVar3 = *puVar1;
  uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  if (uVar3 < 0x7ffffffd) {
    *size = uVar3;
    *data = puVar1 + 1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  puVar2[1] = "invalid blob size";
  *puVar2 = &PTR__exception_0010cc50;
  __cxa_throw(puVar2,&MalformedMessageException::typeinfo,std::exception::~exception);
}

Assistant:

void ReceivedMessageArgument::AsBlobUnchecked( const void*& data, osc_bundle_element_size_t& size ) const
{
    // read blob size as an unsigned int then validate
    osc_bundle_element_size_t sizeResult = (osc_bundle_element_size_t)ToUInt32( argumentPtr_ );
    if( !IsValidElementSizeValue(sizeResult) )
        throw MalformedMessageException("invalid blob size");

    size = sizeResult;
	data = (void*)(argumentPtr_+ osc::OSC_SIZEOF_INT32);
}